

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

int curl_mvsnprintf(char *buffer,size_t maxlength,char *format,__va_list_tag *ap_save)

{
  int iVar1;
  nsprintf info;
  char *local_20;
  size_t local_18;
  size_t local_10;
  
  local_18 = 0;
  local_20 = buffer;
  local_10 = maxlength;
  iVar1 = dprintf_formatf(&local_20,addbyter,format,ap_save);
  if (local_10 != 0 && iVar1 != -1) {
    local_20[-(ulong)(local_10 == local_18)] = '\0';
  }
  return iVar1;
}

Assistant:

int curl_mvsnprintf(char *buffer, size_t maxlength, const char *format,
                    va_list ap_save)
{
  int retcode;
  struct nsprintf info;

  info.buffer = buffer;
  info.length = 0;
  info.max = maxlength;

  retcode = dprintf_formatf(&info, addbyter, format, ap_save);
  if((retcode != -1) && info.max) {
    /* we terminate this with a zero byte */
    if(info.max == info.length)
      /* we're at maximum, scrap the last letter */
      info.buffer[-1] = 0;
    else
      info.buffer[0] = 0;
  }
  return retcode;
}